

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDreamState.hpp
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
TasDREAM::TasmanianDREAM::getApproximateMode
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,TasmanianDREAM *this)

{
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TasDREAM::TasmanianDREAM::getApproximateMode((vector *)this);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> getApproximateMode() const{
        std::vector<double> mode;
        getApproximateMode(mode);
        return mode;
    }